

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O2

PFunction *
FindClassMemberFunction
          (PStruct *selfcls,PStruct *funccls,FName *name,FScriptPosition *sc,bool *error)

{
  uint uVar1;
  DObject *p;
  PFunction *pPVar2;
  char *pcVar3;
  char *message;
  int severity;
  PSymbolTable *symtable;
  FName local_34;
  
  local_34 = (FName)name->Index;
  if (local_34.Index == 0xfb) {
    pPVar2 = (PFunction *)0x0;
  }
  else {
    p = (DObject *)
        PSymbolTable::FindSymbolInTable
                  (&(selfcls->super_PNamedType).super_PCompoundType.super_PType.Symbols,&local_34,
                   &symtable);
    pPVar2 = dyn_cast<PFunction>(p);
    if (p != (DObject *)0x0) {
      if (pPVar2 == (PFunction *)0x0) {
        FScriptPosition::Message
                  (sc,2,"%s is not a member function of %s",
                   FName::NameData.NameArray[name->Index].Text,
                   FName::NameData.NameArray[(selfcls->super_PNamedType).TypeName.Index].Text);
      }
      else {
        uVar1 = ((pPVar2->Variants).Array)->Flags;
        if (((uVar1 & 0x20) == 0) ||
           (symtable == &(funccls->super_PNamedType).super_PCompoundType.super_PType.Symbols)) {
          if (-1 < (char)uVar1) {
            return pPVar2;
          }
          pcVar3 = FName::NameData.NameArray[*(int *)&p->field_0x24].Text;
          message = "Call to deprecated function %s";
          severity = 0;
        }
        else {
          pcVar3 = FName::NameData.NameArray[*(int *)&p->field_0x24].Text;
          message = "%s is declared private and not accessible";
          severity = 2;
        }
        FScriptPosition::Message(sc,severity,message,pcVar3);
      }
    }
  }
  return pPVar2;
}

Assistant:

void SaveStateSourceLines(FState *firststate, TArray<FScriptPosition> &positions)
{
	for (unsigned i = 0; i < positions.Size(); i++)
	{
		StateSourceLines[firststate + i] = positions[i];
	}
}